

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall BaseIndex::Stop(BaseIndex *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 0xe0) != 0) {
    iVar2 = (*((this->m_chain)._M_t.
               super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
               _M_t.
               super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
               super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])()
    ;
    ValidationSignals::UnregisterValidationInterface
              (*(ValidationSignals **)(CONCAT44(extraout_var_00,iVar2) + 0xe0),
               &this->super_CValidationInterface);
  }
  if ((this->m_thread_sync)._M_id._M_thread == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::thread::join();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BaseIndex::Stop()
{
    if (m_chain->context()->validation_signals) {
        m_chain->context()->validation_signals->UnregisterValidationInterface(this);
    }

    if (m_thread_sync.joinable()) {
        m_thread_sync.join();
    }
}